

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  pointer pdVar2;
  pointer pdVar3;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> filtered;
  vector<double,_std::allocator<double>_> test;
  vector<double,_std::allocator<double>_> expectedFilter;
  function<bool_(double)> func;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  vector<double,_std::allocator<double>_> local_50;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_68 = (code *)0x4000000000000000;
  uStack_60 = 0x4002666666666666;
  local_78._M_unused._M_member_pointer = 0x3ff0000000000000;
  local_78._8_8_ = 0x3ff3333333333333;
  local_58 = 0x4008000000000000;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_78;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_90,__l,(allocator_type *)local_38._M_pod_data);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/filter/main.cpp:13:34)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/filter/main.cpp:13:34)>
             ::_M_manager;
  local_78._M_unused._M_member_pointer = 0x3ff0000000000000;
  local_78._8_8_ = 0x3ff3333333333333;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_78;
  std::vector<double,_std::allocator<double>_>::vector(&local_50,__l_00,(allocator_type *)&local_a8)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test filter...",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::vector<double,_std::allocator<double>_>::vector
            (&local_a8,
             (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)local_78._M_pod_data);
  pdVar3 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::function<bool_(double)>::function
            ((function<bool_(double)> *)&local_78,(function<bool_(double)> *)&local_38);
  _Var1 = std::
          copy_if<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::function<bool(double)>>
                    ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )pdVar3,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                               )local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_finish,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     pdVar2,(function<bool_(double)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&local_a8,
             (long)_Var1._M_current -
             (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  pdVar2 = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
    while( true ) {
      if (pdVar2 == local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"passed!",7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_28 != (code *)0x0) {
          (*local_28)(&local_38,&local_38,__destroy_functor);
        }
        if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return 0;
      }
      if ((*pdVar2 != *pdVar3) || (NAN(*pdVar2) || NAN(*pdVar3))) break;
      pdVar2 = pdVar2 + 1;
      pdVar3 = pdVar3 + 1;
    }
  }
  __assert_fail("expectedFilter==filtered",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/filter/main.cpp"
                ,0x11,"int main()");
}

Assistant:

int main(){

  vector<double> test={1.0, 1.2, 2.0, 2.3, 3.0};
  function< bool(double) > func= [] (const double & element){return element<2.0;};
  vector<double> expectedFilter={ 1.0, 1.2};
  cout << "Test filter..." << endl;
  auto filtered = Functional::filter(test,func); 
  assert( expectedFilter==filtered);
  cout << "passed!" << endl;
  
  return 0;

}